

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::Run(cmCTest *this,
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *args,string *output)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  pointer pcVar4;
  cmCTestBuildAndTestHandler *__s1;
  pointer ppcVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var12;
  ulong uVar13;
  pointer pbVar14;
  long lVar15;
  pointer ppcVar16;
  cmCTest *this_00;
  uint uVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  char *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  size_type __rlen;
  byte bVar19;
  uint uVar20;
  string_view varg1;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  initializer_list<cmCTestGenericHandler_*> __l;
  bool SRArgumentSpecified;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> presetName;
  string arg;
  string errormsg;
  bool local_241;
  size_t local_240;
  cmCTest *local_238;
  string local_230;
  uint local_210;
  uint local_20c;
  cmCTestBuildAndTestHandler *local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_200;
  undefined1 local_1f8 [24];
  pointer local_1e0;
  cmCTest *local_1d8;
  long *local_1d0 [2];
  _Base_ptr local_1c0 [2];
  _Base_ptr local_1b0;
  string local_1a8;
  _Base_ptr local_188;
  _Base_ptr local_180;
  cmCTestConfigureHandler *local_178;
  cmCTestMemCheckHandler *local_170;
  cmCTestSubmitHandler *local_168;
  _Base_ptr local_160;
  ios_base local_138 [264];
  
  local_241 = false;
  _Var2._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  pbVar14 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  local_238 = this;
  local_1b0 = (_Base_ptr)output;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &(_Var2._M_head_impl)->InitialCommandLineArguments,
             ((_Var2._M_head_impl)->InitialCommandLineArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  __it._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  _Var12 = std::
           __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[15]>>
                     ((args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,__it._M_current,"--list-presets");
  this_01 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar15 = (long)pbVar3 - (long)this_01 >> 7;
  if (0 < lVar15) {
    lVar15 = lVar15 + 1;
    do {
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
              ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                            *)this_01,__it);
      this_00 = local_238;
      pbVar18 = this_01;
      if (bVar6) goto LAB_00186f7c;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
              ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                            *)(this_01 + 1),__it);
      this_00 = local_238;
      pbVar18 = this_01 + 1;
      if (bVar6) goto LAB_00186f7c;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
              ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                            *)(this_01 + 2),__it);
      this_00 = local_238;
      pbVar18 = this_01 + 2;
      if (bVar6) goto LAB_00186f7c;
      bVar6 = __gnu_cxx::__ops::
              _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
              ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                            *)(this_01 + 3),__it);
      this_00 = local_238;
      pbVar18 = this_01 + 3;
      if (bVar6) goto LAB_00186f7c;
      this_01 = this_01 + 4;
      lVar15 = lVar15 + -1;
    } while (1 < lVar15);
  }
  this_00 = local_238;
  lVar15 = (long)pbVar3 - (long)this_01 >> 5;
  if (lVar15 == 1) {
LAB_00186f6b:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)this_01,__it);
    pbVar18 = this_01;
    if (!bVar6) {
      pbVar18 = pbVar3;
    }
  }
  else if (lVar15 == 2) {
LAB_00186f4a:
    bVar6 = __gnu_cxx::__ops::
            _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
            ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                          *)this_01,__it);
    pbVar18 = this_01;
    if (!bVar6) {
      this_01 = this_01 + 1;
      goto LAB_00186f6b;
    }
  }
  else {
    pbVar18 = pbVar3;
    if ((lVar15 == 3) &&
       (bVar6 = __gnu_cxx::__ops::
                _Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::$_0>
                ::operator()((_Iter_pred<cmCTest::Run(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string*)::__0>
                              *)this_01,__it), pbVar18 = this_01, !bVar6)) {
      this_01 = this_01 + 1;
      goto LAB_00186f4a;
    }
  }
LAB_00186f7c:
  if ((_Var12._M_current == pbVar3) &&
     (pbVar18 ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) goto LAB_0018703b;
  paVar1 = &local_1a8.field_2;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_allocated_capacity =
       local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1a8._M_dataplus._M_p = (pointer)paVar1;
  if (_Var12._M_current == pbVar3) {
    local_230._M_string_length = (size_type)(pbVar18->_M_dataplus)._M_p;
    local_230._M_dataplus._M_p = (pointer)pbVar18->_M_string_length;
    __str_00._M_str = "--preset=";
    __str_00._M_len = 9;
    in_R8 = "--preset=";
    iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_230,0,9,__str_00);
    if (iVar9 == 0) {
      std::__cxx11::string::substr((ulong)&local_230,(ulong)pbVar18);
      bVar6 = SetArgsFromPreset(this_00,&local_230,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) goto LAB_00186fec;
    }
    else {
      if (pbVar18 + 1 !=
          (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish) {
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        pcVar4 = pbVar18[1]._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_230,pcVar4,pcVar4 + pbVar18[1]._M_string_length);
        bVar6 = SetArgsFromPreset(local_238,&local_230,false);
        goto LAB_00186fe0;
      }
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"\'--preset\' requires an argument","");
      cmSystemTools::Error(&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                 local_230.field_2._M_local_buf[0]) + 1);
      }
      bVar6 = false;
    }
  }
  else {
    local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"");
    bVar6 = SetArgsFromPreset(local_238,&local_230,true);
LAB_00186fe0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
LAB_00186fec:
      operator_delete(local_230._M_dataplus._M_p,
                      CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                               local_230.field_2._M_local_buf[0]) + 1);
    }
  }
  bVar19 = _Var12._M_current != pbVar3 & bVar6 ^ 1;
  pbVar14 = (pointer)(ulong)bVar19;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1a8._M_dataplus._M_p,(ulong)(local_1a8.field_2._M_allocated_capacity + 1))
    ;
  }
  this_00 = local_238;
  if ((_Var12._M_current == pbVar3 & bVar6) == 0) {
    return (uint)bVar19;
  }
LAB_0018703b:
  uVar11 = (uint)pbVar14;
  local_240 = 1;
  uVar13 = (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
           (long)(args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
  bVar6 = uVar13 >= 0x21;
  if (uVar13 < 0x21) {
    uVar17 = 1;
    uVar20 = 0;
  }
  else {
    local_210 = (uint)CONCAT71((int7)(uVar13 >> 8),1);
    local_20c = 0;
    uVar13 = (ulong)pbVar14 & 0xffffffff;
    do {
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      local_230._M_string_length = 0;
      local_230.field_2._M_local_buf[0] = '\0';
      bVar7 = HandleCommandLineArguments(this_00,&local_240,args,&local_230);
      if (bVar7) {
        HandleScriptArguments(this_00,&local_240,args,&local_241);
        pbVar14 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pcVar4 = pbVar14[local_240]._M_dataplus._M_p;
        local_208 = (cmCTestBuildAndTestHandler *)local_1f8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_208,pcVar4,pcVar4 + pbVar14[local_240]._M_string_length);
        varg1._M_str = "--dashboard";
        varg1._M_len = (size_t)"-D";
        bVar7 = CheckArgument((cmCTest *)&local_208,(string *)&DAT_00000002,varg1,in_R8);
        if ((bVar7) &&
           (pbVar14 = (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start,
           local_240 <
           ((long)(args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar14 >> 5) - 1U)) {
          ((this_00->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          local_240 = local_240 + 1;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          pcVar4 = pbVar14[local_240]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,pcVar4,pcVar4 + pbVar14[local_240]._M_string_length);
          bVar7 = AddTestsForDashboardType(this_00,&local_1a8);
          if ((!bVar7) && (bVar7 = AddVariableDefinition(this_00,&local_1a8), !bVar7)) {
            ErrorMessageUnknownDashDValue(this_00,&local_1a8);
            local_210 = 0;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
        }
        iVar9 = std::__cxx11::string::compare((char *)&local_208);
        if (iVar9 != 0) {
          local_1a8._M_dataplus._M_p = (pointer)local_200;
          local_1a8._M_string_length = (size_type)local_208;
          __str._M_str = "-D";
          __str._M_len = 2;
          in_R8 = "-D";
          iVar9 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)&local_1a8,0,2,
                             __str);
          if (iVar9 == 0) {
            std::__cxx11::string::substr((ulong)&local_1a8,(ulong)&local_208);
            AddVariableDefinition(this_00,&local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,
                              (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
            }
          }
        }
        bVar7 = HandleTestActionArgument(this_00,"ctest",&local_240,args);
        bVar8 = HandleTestModelArgument(this_00,"ctest",&local_240,args);
        local_210 = local_210 & 0xff;
        if (!bVar8) {
          local_210 = 0;
        }
        if (!bVar7) {
          local_210 = 0;
        }
        if (((local_200 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0xe) && (iVar9 = bcmp(local_208,"--extra-submit",0xe), iVar9 == 0)) &&
           (local_240 <
            ((long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
          ((this_00->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ProduceXML = true;
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Submit","");
          SetTest(this_00,&local_1a8,true);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          local_240 = local_240 + 1;
          bVar8 = SubmitExtraFiles(this_00,(args->
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           )._M_impl.super__Vector_impl_data._M_start + local_240);
          bVar7 = false;
          if (bVar8) goto LAB_0018737b;
          uVar13 = 0;
        }
        else {
LAB_0018737b:
          paVar1 = local_200;
          __s1 = local_208;
          if (((local_200 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x10) && (iVar9 = bcmp(local_208,"--build-and-test",0x10), iVar9 == 0)) &&
             (local_20c = local_20c & 0xff,
             local_240 <
             ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U)) {
            local_20c = 1;
          }
          if ((paVar1 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)&DAT_00000011) &&
             (iVar9 = bcmp(__s1,"--schedule-random",0x11), iVar9 == 0)) {
            _Var2._M_head_impl =
                 (this_00->Impl)._M_t.
                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
                 super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
            in_R8 = (char *)0x6;
            std::__cxx11::string::_M_replace
                      ((ulong)&(_Var2._M_head_impl)->ScheduleType,0,
                       (char *)((_Var2._M_head_impl)->ScheduleType)._M_string_length,0x74e672);
          }
          _Var2._M_head_impl =
               (this_00->Impl)._M_t.
               super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
               super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
               super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
          local_1a8._M_dataplus._M_p = (pointer)&(_Var2._M_head_impl)->BuildHandler;
          local_1a8._M_string_length = (size_type)&(_Var2._M_head_impl)->BuildAndTestHandler;
          local_1a8.field_2._M_allocated_capacity =
               (size_type)&(_Var2._M_head_impl)->CoverageHandler;
          local_1a8.field_2._8_8_ = &(_Var2._M_head_impl)->ScriptHandler;
          local_188 = (_Base_ptr)&(_Var2._M_head_impl)->TestHandler;
          local_180 = (_Base_ptr)&(_Var2._M_head_impl)->UpdateHandler;
          local_178 = &(_Var2._M_head_impl)->ConfigureHandler;
          local_170 = &(_Var2._M_head_impl)->MemCheckHandler;
          local_168 = &(_Var2._M_head_impl)->SubmitHandler;
          local_160 = (_Base_ptr)&(_Var2._M_head_impl)->UploadHandler;
          __l._M_len = 10;
          __l._M_array = (iterator)&local_1a8;
          std::vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_>::vector
                    ((vector<cmCTestGenericHandler_*,_std::allocator<cmCTestGenericHandler_*>_> *)
                     (local_1f8 + 0x10),__l,(allocator_type *)local_1d0);
          ppcVar5 = local_1e0;
          ppcVar16 = (pointer)local_1f8._16_8_;
          while( true ) {
            bVar7 = ppcVar16 == ppcVar5;
            if (bVar7) break;
            iVar9 = (*(*ppcVar16)->_vptr_cmCTestGenericHandler[2])
                              (*ppcVar16,&local_208,&local_240,args);
            if (iVar9 == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,
                         "Problem parsing command line arguments within a handler",0x37);
              std::__cxx11::stringbuf::str();
              in_R8 = (char *)local_1d0[0];
              Log(local_238,7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                  ,0xaca,(char *)local_1d0[0],false);
              if ((_Base_ptr *)local_1d0[0] != local_1c0) {
                operator_delete(local_1d0[0],(ulong)((long)&local_1c0[0]->_M_color + 1));
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
              std::ios_base::~ios_base(local_138);
              uVar13 = 0;
            }
            if (iVar9 == 0) break;
            ppcVar16 = ppcVar16 + 1;
          }
          this_00 = local_238;
          if ((pointer)local_1f8._16_8_ != (pointer)0x0) {
            operator_delete((void *)local_1f8._16_8_,(long)local_1d8 - local_1f8._16_8_);
            this_00 = local_238;
          }
        }
        if (local_208 != (cmCTestBuildAndTestHandler *)local_1f8) {
          operator_delete(local_208,local_1f8._0_8_ + 1);
        }
      }
      else {
        cmSystemTools::Error(&local_230);
        uVar13 = 1;
        bVar7 = false;
      }
      uVar11 = (uint)uVar13;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,
                        CONCAT71(local_230.field_2._M_allocated_capacity._1_7_,
                                 local_230.field_2._M_local_buf[0]) + 1);
      }
      uVar17 = local_210;
      uVar20 = local_20c;
      if (!bVar7) break;
      local_240 = local_240 + 1;
      bVar6 = local_240 <
              (ulong)((long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5);
    } while (bVar6);
  }
  if (!bVar6) {
    if (((this_00->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ParallelLevelSetInCli ==
        false) {
      local_1a8._M_string_length = 0;
      local_1a8.field_2._M_allocated_capacity =
           local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      bVar6 = cmsys::SystemTools::GetEnv("CTEST_PARALLEL_LEVEL",&local_1a8);
      if (bVar6) {
        iVar10 = atoi(local_1a8._M_dataplus._M_p);
        iVar9 = 1;
        if (1 < iVar10) {
          iVar9 = iVar10;
        }
        ((this_00->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->ParallelLevel = iVar9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
    }
    _Var2._M_head_impl =
         (this_00->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if (((_Var2._M_head_impl)->TestProgressOutput == true) &&
       ((tuple<cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>)
        *(tuple<cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_> *)
         &((_Var2._M_head_impl)->OutputLogFile)._M_t ==
        (__uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>)0x0)) {
      bVar6 = ConsoleIsNotDumb();
    }
    else {
      bVar6 = false;
    }
    ((this_00->Impl)._M_t.
     super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
     super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
     super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->TestProgressOutput = bVar6;
    if ((uVar20 & 1) == 0) {
      uVar11 = 1;
      if ((uVar17 & 1) != 0) {
        uVar11 = ExecuteTests(this_00);
      }
    }
    else {
      uVar11 = RunCMakeAndTest(this_00,(string *)local_1b0);
    }
  }
  return uVar11;
}

Assistant:

int cmCTest::Run(std::vector<std::string>& args, std::string* output)
{
  const char* ctestExec = "ctest";
  bool cmakeAndTest = false;
  bool executeTests = true;
  bool SRArgumentSpecified = false;

  // copy the command line
  cm::append(this->Impl->InitialCommandLineArguments, args);

  // check if a test preset was specified

  bool listPresets =
    find(args.begin(), args.end(), "--list-presets") != args.end();
  auto it =
    std::find_if(args.begin(), args.end(), [](std::string const& arg) -> bool {
      return arg == "--preset" || cmHasLiteralPrefix(arg, "--preset=");
    });
  if (listPresets || it != args.end()) {
    std::string errormsg;
    bool success;

    if (listPresets) {
      // If listing presets we don't need a presetName
      success = this->SetArgsFromPreset("", listPresets);
    } else {
      if (cmHasLiteralPrefix(*it, "--preset=")) {
        auto presetName = it->substr(9);
        success = this->SetArgsFromPreset(presetName, listPresets);
      } else if (++it != args.end()) {
        auto presetName = *it;
        success = this->SetArgsFromPreset(presetName, listPresets);
      } else {
        cmSystemTools::Error("'--preset' requires an argument");
        success = false;
      }
    }

    if (listPresets) {
      return success ? 0 : 1;
    }

    if (!success) {
      return 1;
    }
  }

  // process the command line arguments
  for (size_t i = 1; i < args.size(); ++i) {
    // handle the simple commandline arguments
    std::string errormsg;
    if (!this->HandleCommandLineArguments(i, args, errormsg)) {
      cmSystemTools::Error(errormsg);
      return 1;
    }

    // handle the script arguments -S -SR -SP
    this->HandleScriptArguments(i, args, SRArgumentSpecified);

    // --dashboard: handle a request for a dashboard
    std::string arg = args[i];
    if (this->CheckArgument(arg, "-D"_s, "--dashboard") &&
        i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      i++;
      std::string targ = args[i];
      // AddTestsForDashboard parses the dashboard type and converts it
      // into the separate stages
      if (!this->AddTestsForDashboardType(targ)) {
        if (!this->AddVariableDefinition(targ)) {
          this->ErrorMessageUnknownDashDValue(targ);
          executeTests = false;
        }
      }
    }

    // If it's not exactly -D, but it starts with -D, then try to parse out
    // a variable definition from it, same as CMake does. Unsuccessful
    // attempts are simply ignored since previous ctest versions ignore
    // this too. (As well as many other unknown command line args.)
    //
    if (arg != "-D" && cmHasLiteralPrefix(arg, "-D")) {
      std::string input = arg.substr(2);
      this->AddVariableDefinition(input);
    }

    // --test-action: calls SetTest(<stage>, /*report=*/ false) to enable
    // the corresponding stage
    if (!this->HandleTestActionArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --test-model: what type of test model
    if (!this->HandleTestModelArgument(ctestExec, i, args)) {
      executeTests = false;
    }

    // --extra-submit
    if (this->CheckArgument(arg, "--extra-submit"_s) && i < args.size() - 1) {
      this->Impl->ProduceXML = true;
      this->SetTest("Submit");
      i++;
      if (!this->SubmitExtraFiles(args[i])) {
        return 0;
      }
    }

    // --build-and-test options
    if (this->CheckArgument(arg, "--build-and-test"_s) &&
        i < args.size() - 1) {
      cmakeAndTest = true;
    }

    // --schedule-random
    if (this->CheckArgument(arg, "--schedule-random"_s)) {
      this->Impl->ScheduleType = "Random";
    }

    // pass the argument to all the handlers as well, but it may no longer be
    // set to what it was originally so I'm not sure this is working as
    // intended
    for (auto& handler : this->Impl->GetTestingHandlers()) {
      if (!handler->ProcessCommandLineArguments(arg, i, args)) {
        cmCTestLog(this, ERROR_MESSAGE,
                   "Problem parsing command line arguments within a handler");
        return 0;
      }
    }
  } // the close of the for argument loop

  // handle CTEST_PARALLEL_LEVEL environment variable
  if (!this->Impl->ParallelLevelSetInCli) {
    std::string parallel;
    if (cmSystemTools::GetEnv("CTEST_PARALLEL_LEVEL", parallel)) {
      int plevel = atoi(parallel.c_str());
      this->SetParallelLevel(plevel);
    }
  }

  // TestProgressOutput only supported if console supports it and not logging
  // to a file
  this->Impl->TestProgressOutput = this->Impl->TestProgressOutput &&
    !this->Impl->OutputLogFile && this->ProgressOutputSupportedByConsole();
#ifdef _WIN32
  if (this->Impl->TestProgressOutput) {
    // Disable output line buffering so we can print content without
    // a newline.
    std::setvbuf(stdout, nullptr, _IONBF, 0);
  }
#endif

  // now what should cmake do? if --build-and-test was specified then
  // we run the build and test handler and return
  if (cmakeAndTest) {
    return this->RunCMakeAndTest(output);
  }

  if (executeTests) {
    return this->ExecuteTests();
  }

  return 1;
}